

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basics.cpp
# Opt level: O3

void parallel_runs(uint w)

{
  code *pcVar1;
  double dVar2;
  allocator_type *paVar3;
  pointer ptVar4;
  pointer ptVar5;
  char extraout_AL;
  bool bVar6;
  char extraout_AL_00;
  unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_> *__cur;
  ulong uVar7;
  allocator_type *paVar8;
  anon_class_16_2_65e19626_for__M_head_impl *extraout_RDX;
  anon_class_16_2_65e19626_for__M_head_impl *extraout_RDX_00;
  anon_class_16_2_65e19626_for__M_head_impl *extraout_RDX_01;
  anon_class_16_2_65e19626_for__M_head_impl *extraout_RDX_02;
  anon_class_16_2_65e19626_for__M_head_impl *extraout_RDX_03;
  anon_class_16_2_65e19626_for__M_head_impl *extraout_RDX_04;
  anon_class_16_2_65e19626_for__M_head_impl *__args;
  anon_class_40_5_6a14f4ba_for__M_head_impl *extraout_RDX_05;
  anon_class_40_5_6a14f4ba_for__M_head_impl *extraout_RDX_06;
  anon_class_40_5_6a14f4ba_for__M_head_impl *extraout_RDX_07;
  anon_class_40_5_6a14f4ba_for__M_head_impl *extraout_RDX_08;
  anon_class_40_5_6a14f4ba_for__M_head_impl *extraout_RDX_09;
  anon_class_40_5_6a14f4ba_for__M_head_impl *__args_00;
  thread *t;
  pointer puVar9;
  ulong uVar10;
  allocator_type *paVar11;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  int iVar12;
  ulong uVar13;
  allocator_type *paVar14;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar16;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  atomic<int> counter;
  atomic<unsigned_long> barrier;
  ResultBuilder DOCTEST_RB;
  anon_class_8_1_bc7188dc make_taskflow;
  vector<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
  taskflows;
  Executor executor;
  vector<std::thread,_std::allocator<std::thread>_> local_2b8;
  uint local_298;
  uint local_294;
  undefined8 local_290;
  Result local_288;
  undefined1 local_268 [16];
  uint **local_258;
  __native_type *local_250;
  char *local_248;
  undefined2 local_240;
  anon_union_24_2_13149d16_for_String_2 local_238;
  anon_union_24_2_13149d16_for_String_2 aStack_220;
  bool local_208;
  char *local_200;
  char *local_1f8;
  uint *local_1f0;
  vector<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
  local_1e8;
  int local_1cc;
  shared_ptr<tf::WorkerInterface> local_1c8;
  shared_ptr<tf::WorkerInterface> local_1b8;
  Subcase local_1a0;
  ulong local_170;
  __native_type local_168 [2];
  unique_lock local_108 [48];
  undefined1 local_d8 [40];
  long local_b0;
  
  local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = &local_298;
  doctest::String::String((String *)&local_168[0].__data,"RunAndWait",10);
  doctest::detail::Subcase::Subcase
            (&local_1a0,(String *)&local_168[0].__data,
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_basics.cpp"
             ,0x328);
  if (((char)local_168[0]._23_1_ < '\0') && ((void *)local_168[0]._0_8_ != (void *)0x0)) {
    operator_delete__((void *)local_168[0]._0_8_);
  }
  if (local_1a0.m_entered == true) {
    local_1b8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1b8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    tf::Executor::Executor((Executor *)&local_168[0].__data,(ulong)w,&local_1b8);
    __args = extraout_RDX;
    local_294 = w;
    if (local_1b8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      __args = extraout_RDX_00;
    }
    iVar12 = 0;
    LOCK();
    local_298 = 0;
    UNLOCK();
    do {
      ptVar5 = local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar4 = local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_268._0_8_ = &local_1f0;
      local_268._8_8_ = local_168;
      if (local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        if ((long)local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar10 = (long)local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        uVar7 = uVar10 + (uVar10 == 0);
        uVar13 = uVar7 + uVar10;
        if (0xffffffffffffffe < uVar13) {
          uVar13 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar7,uVar10)) {
          uVar13 = 0xfffffffffffffff;
        }
        if (uVar13 == 0) {
          paVar11 = (allocator_type *)0x0;
        }
        else {
          paVar11 = (allocator_type *)
                    __gnu_cxx::new_allocator<std::thread>::allocate
                              ((new_allocator<std::thread> *)&local_2b8,uVar13,(void *)0x0);
          __args = extraout_RDX_02;
        }
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,parallel_runs(unsigned_int)::__1>
                  (paVar11 + uVar10 * 8,(thread *)local_268,__args);
        paVar14 = paVar11;
        for (paVar8 = (allocator_type *)ptVar4; paVar8 != (allocator_type *)ptVar5;
            paVar8 = paVar8 + 8) {
          *(native_handle_type *)paVar14 = (native_handle_type)*(id *)paVar8;
          *(id *)paVar8 = (id)0x0;
          paVar14 = paVar14 + 8;
        }
        __args = extraout_RDX_03;
        if ((allocator_type *)ptVar4 != (allocator_type *)0x0) {
          operator_delete(ptVar4,(long)local_2b8.
                                       super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)ptVar4);
          __args = extraout_RDX_04;
        }
        local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(paVar11 + uVar13 * 8);
        local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)paVar11;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,parallel_runs(unsigned_int)::__1>
                  ((allocator_type *)
                   local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish,(thread *)local_268,__args);
        __args = extraout_RDX_01;
        paVar14 = (allocator_type *)
                  local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      paVar14 = paVar14 + 8;
      iVar12 = iVar12 + 1;
      local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)paVar14;
      paVar11 = (allocator_type *)
                local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (iVar12 != 0x20);
    for (; paVar8 = (allocator_type *)
                    local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish,
        paVar3 = (allocator_type *)
                 local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start, paVar11 != paVar14; paVar11 = paVar11 + 8) {
      std::thread::join();
    }
    for (; (allocator_type *)
           local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish != paVar3; paVar3 = paVar3 + 8) {
      if (((native_handle_type)*(id *)paVar3)._M_thread != 0) goto LAB_001211d0;
      paVar8 = (allocator_type *)
               local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    local_238.buf[0] = '\0';
    local_238.buf[0x17] = '\x17';
    aStack_220.buf[0] = '\0';
    aStack_220.buf[0x17] = '\x17';
    local_268._0_8_ = *(native_handle_type *)(doctest::detail::g_cs + 0x20);
    local_268._12_4_ = (undefined4)((ulong)local_268._8_8_ >> 0x20);
    local_268._8_4_ = 0xc;
    local_258 = (uint **)0x142622;
    local_250 = (__native_type *)CONCAT44(local_250._4_4_,0x338);
    local_248 = "counter.load() == 32*1024*2";
    local_240._0_1_ = true;
    local_240._1_1_ = false;
    local_208 = false;
    local_200 = "";
    local_1f8 = "";
    local_1e8.
    super__Vector_base<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)((ulong)local_298 | 0xc00000000);
    uVar13 = (ulong)local_290 >> 0x20;
    local_290 = CONCAT44((int)uVar13,0x10000);
    local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)paVar8;
    doctest::detail::Expression_lhs<int_const>::operator==
              (&local_288,(Expression_lhs<int_const> *)&local_1e8,(int *)&local_290);
    w = local_294;
    doctest::String::operator=((String *)&aStack_220.data,&local_288.m_decomp);
    local_240 = CONCAT11(local_240._1_1_,local_288.m_passed) ^ 1;
    uVar15 = extraout_XMM0_Da;
    uVar16 = extraout_XMM0_Db;
    if ((local_288.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_288.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_288.m_decomp.field_0.data.ptr);
      uVar15 = extraout_XMM0_Da_00;
      uVar16 = extraout_XMM0_Db_00;
    }
    dVar2 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)local_268,(double)CONCAT44(uVar16,uVar15));
    if (extraout_AL != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)(SUB84(dVar2,0));
      return;
    }
    if (local_240._0_1_ == true) {
      bVar6 = doctest::detail::checkIfShouldThrow(local_268._8_4_);
      if (bVar6) {
        doctest::detail::throwException();
      }
    }
    if ((aStack_220.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_220._1_7_,aStack_220.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_220._1_7_,aStack_220.buf[0]));
    }
    if ((local_238.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_238._1_7_,local_238.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_238._1_7_,local_238.buf[0]));
    }
    tf::Executor::~Executor((Executor *)&local_168[0].__data);
  }
  doctest::detail::Subcase::~Subcase(&local_1a0);
  doctest::String::String((String *)&local_168[0].__data,"RunAndWaitForAll",0x10);
  doctest::detail::Subcase::Subcase
            (&local_1a0,(String *)&local_168[0].__data,
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_basics.cpp"
             ,0x33c);
  if (((char)local_168[0]._23_1_ < '\0') && ((void *)local_168[0]._0_8_ != (void *)0x0)) {
    operator_delete__((void *)local_168[0]._0_8_);
  }
  if (local_1a0.m_entered == true) {
    local_1c8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1c8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    tf::Executor::Executor((Executor *)&local_168[0].__data,(ulong)w,&local_1c8);
    if (local_1c8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1c8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    LOCK();
    local_298 = 0;
    UNLOCK();
    iVar12 = 0;
    local_1e8.
    super__Vector_base<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x100);
    puVar9 = local_1e8.
             super__Vector_base<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x20;
    memset(local_1e8.
           super__Vector_base<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start,0,0x100);
    local_290 = 0;
    __args_00 = extraout_RDX_05;
    local_1e8.
    super__Vector_base<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar9;
    local_1e8.
    super__Vector_base<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar9;
    do {
      ptVar5 = local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar4 = local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_268._0_4_ = iVar12;
      local_268._8_8_ = &local_1e8;
      local_258 = &local_1f0;
      local_250 = local_168;
      local_248 = (char *)&local_290;
      if (local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        if ((long)local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar10 = (long)local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        uVar7 = uVar10 + (uVar10 == 0);
        uVar13 = uVar7 + uVar10;
        if (0xffffffffffffffe < uVar13) {
          uVar13 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar7,uVar10)) {
          uVar13 = 0xfffffffffffffff;
        }
        if (uVar13 == 0) {
          paVar11 = (allocator_type *)0x0;
        }
        else {
          paVar11 = (allocator_type *)
                    __gnu_cxx::new_allocator<std::thread>::allocate
                              ((new_allocator<std::thread> *)&local_2b8,uVar13,(void *)0x0);
          __args_00 = extraout_RDX_07;
        }
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,parallel_runs(unsigned_int)::__2>
                  (paVar11 + uVar10 * 8,(thread *)local_268,__args_00);
        paVar14 = paVar11;
        for (paVar8 = (allocator_type *)ptVar4; paVar8 != (allocator_type *)ptVar5;
            paVar8 = paVar8 + 8) {
          *(native_handle_type *)paVar14 = ((native_handle_type)*(id *)paVar8)._M_thread;
          *(id *)paVar8 = (id)0x0;
          paVar14 = paVar14 + 8;
        }
        __args_00 = extraout_RDX_08;
        if ((allocator_type *)ptVar4 != (allocator_type *)0x0) {
          operator_delete(ptVar4,(long)local_2b8.
                                       super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)ptVar4);
          __args_00 = extraout_RDX_09;
        }
        local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(paVar11 + uVar13 * 8);
        local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)paVar11;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,parallel_runs(unsigned_int)::__2>
                  ((allocator_type *)
                   local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish,(thread *)local_268,__args_00);
        __args_00 = extraout_RDX_06;
        paVar14 = (allocator_type *)
                  local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(paVar14 + 8);
      iVar12 = iVar12 + 1;
    } while (iVar12 != 0x20);
    do {
    } while (local_290 != 0x20);
    local_268._0_8_ = local_d8;
    local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_268);
    local_268[8] = 1;
    if (local_b0 != 0) {
      do {
        std::condition_variable::wait(local_108);
      } while (local_b0 != 0);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_268);
    local_238.buf[0] = '\0';
    local_238.buf[0x17] = '\x17';
    aStack_220.buf[0] = '\0';
    aStack_220.buf[0x17] = '\x17';
    local_268._0_8_ = *(native_handle_type *)(doctest::detail::g_cs + 0x20);
    local_268._8_4_ = 0xc;
    local_258 = (uint **)0x142622;
    local_250 = (__native_type *)CONCAT44(local_250._4_4_,0x34c);
    local_248 = "counter.load() == 32*1024*2";
    local_240._0_1_ = true;
    local_240._1_1_ = false;
    local_208 = false;
    local_200 = "";
    local_1f8 = "";
    local_170 = (ulong)local_298 | 0xc00000000;
    local_1cc = 0x10000;
    doctest::detail::Expression_lhs<int_const>::operator==
              (&local_288,(Expression_lhs<int_const> *)&local_170,&local_1cc);
    doctest::String::operator=((String *)&aStack_220.data,&local_288.m_decomp);
    local_240 = CONCAT11(local_240._1_1_,local_288.m_passed) ^ 1;
    uVar15 = extraout_XMM0_Da_01;
    uVar16 = extraout_XMM0_Db_01;
    if ((local_288.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_288.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_288.m_decomp.field_0.data.ptr);
      uVar15 = extraout_XMM0_Da_02;
      uVar16 = extraout_XMM0_Db_02;
    }
    dVar2 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)local_268,(double)CONCAT44(uVar16,uVar15));
    if (extraout_AL_00 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)(SUB84(dVar2,0));
      return;
    }
    if (local_240._0_1_ == true) {
      bVar6 = doctest::detail::checkIfShouldThrow(local_268._8_4_);
      if (bVar6) {
        doctest::detail::throwException();
      }
    }
    if ((aStack_220.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_220._1_7_,aStack_220.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_220._1_7_,aStack_220.buf[0]));
    }
    if ((local_238.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_238._1_7_,local_238.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_238._1_7_,local_238.buf[0]));
    }
    ptVar4 = local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    paVar11 = (allocator_type *)
              local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        std::thread::join();
        paVar11 = paVar11 + 8;
      } while (paVar11 != (allocator_type *)ptVar4);
      paVar11 = (allocator_type *)
                local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start) {
        do {
          if (((native_handle_type)*(id *)paVar11)._M_thread != 0) {
LAB_001211d0:
            std::terminate();
          }
          paVar11 = paVar11 + 8;
        } while (paVar11 !=
                 (allocator_type *)
                 local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish);
        local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_2b8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
    }
    std::
    vector<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
    ::~vector(&local_1e8);
    tf::Executor::~Executor((Executor *)&local_168[0].__data);
  }
  doctest::detail::Subcase::~Subcase(&local_1a0);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_2b8);
  return;
}

Assistant:

void parallel_runs(unsigned w) {

  std::atomic<int> counter;
  std::vector<std::thread> threads;

  auto make_taskflow = [&] (tf::Taskflow& tf) {
    for(int i=0; i<1024; i++) {
      auto A = tf.emplace([&] () {
        counter.fetch_add(1, std::memory_order_relaxed);
      });
      auto B = tf.emplace([&] () {
        counter.fetch_add(1, std::memory_order_relaxed);
      });
      A.precede(B);
    }
  };

  SUBCASE("RunAndWait") {
    tf::Executor executor(w);
    counter = 0;
    for(int t=0; t<32; t++) {
      threads.emplace_back([&] () {
        tf::Taskflow taskflow;
        make_taskflow(taskflow);
        executor.run(taskflow).wait();
      });
    }

    for(auto& t : threads) {
      t.join();
    }
    threads.clear();

    REQUIRE(counter.load() == 32*1024*2);

  }

  SUBCASE("RunAndWaitForAll") {
    tf::Executor executor(w);
    counter = 0;
    std::vector<std::unique_ptr<tf::Taskflow>> taskflows(32);
    std::atomic<size_t> barrier(0);
    for(int t=0; t<32; t++) {
      threads.emplace_back([&, t=t] () {
        taskflows[t] = std::make_unique<tf::Taskflow>();
        make_taskflow(*taskflows[t]);
        executor.run(*taskflows[t]);
        ++barrier;    // make sure all runs are issued
      });
    }

    while(barrier != 32);
    executor.wait_for_all();
    REQUIRE(counter.load() == 32*1024*2);

    for(auto& t : threads) {
      t.join();
    }
    threads.clear();
  }
}